

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O3

void __thiscall DSDcc::DSDdPMR::processSuperFrame(DSDdPMR *this)

{
  int dibit;
  char cVar1;
  byte bVar2;
  int symbolIndex;
  uint symbolIndex_00;
  double __x;
  
  dibit = DSDSymbol::getDibit(&this->m_dsdDecoder->m_dsdSymbol);
  symbolIndex_00 = this->m_symbolIndex;
  if (symbolIndex_00 == 0) {
    this->m_frameType = DPMRPayloadFrame;
    this->m_frameIndex = 0;
    DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,__x);
    symbolIndex_00 = this->m_symbolIndex;
  }
  if ((int)symbolIndex_00 < 0x24) {
    this->m_calledIdHalf = false;
    this->m_ownIdHalf = false;
  }
  else {
    cVar1 = (char)symbolIndex_00;
    if (symbolIndex_00 < 0xb4) {
      if ((this->m_frameType & ~DPMRExtSearchFrame) != DPMRVoiceframe) goto LAB_0011af25;
      bVar2 = cVar1 - 0x24;
LAB_0011af03:
      processVoiceFrame(this,(uint)(byte)(bVar2 + (bVar2 / 9 & 0xfc) * -9),dibit);
      symbolIndex_00 = this->m_symbolIndex;
LAB_0011af25:
      this->m_symbolIndex = symbolIndex_00 + 1;
      return;
    }
    if (symbolIndex_00 < 0xc0) {
      symbolIndex = symbolIndex_00 - 0xb4;
LAB_0011af3f:
      processColourCode(this,symbolIndex,dibit);
      goto LAB_0011aee7;
    }
    if (symbolIndex_00 < 0xe4) {
      symbolIndex_00 = symbolIndex_00 - 0xc0;
    }
    else {
      if (symbolIndex_00 < 0x174) {
        if ((this->m_frameType & ~DPMRExtSearchFrame) != DPMRVoiceframe) goto LAB_0011af25;
        bVar2 = cVar1 + 0x1c;
        goto LAB_0011af03;
      }
      if (symbolIndex_00 < 0x180) {
        processFS2(this,symbolIndex_00 - 0x174,dibit);
        goto LAB_0011aee7;
      }
      if (symbolIndex_00 < 0x1a4) {
        symbolIndex_00 = symbolIndex_00 - 0x180;
      }
      else {
        if (symbolIndex_00 < 0x234) {
          if ((this->m_frameType & ~DPMRExtSearchFrame) != DPMRVoiceframe) goto LAB_0011af25;
          bVar2 = cVar1 + 0x5c;
          goto LAB_0011af03;
        }
        if (symbolIndex_00 < 0x240) {
          symbolIndex = symbolIndex_00 - 0x234;
          goto LAB_0011af3f;
        }
        if (0x263 < symbolIndex_00) {
          if (0x2f3 < symbolIndex_00) {
            this->m_frameType = DPMRNoFrame;
            DSDDecoder::resetFrameSync(this->m_dsdDecoder);
            return;
          }
          if ((this->m_frameType & ~DPMRExtSearchFrame) == DPMRVoiceframe) {
            processVoiceFrame(this,(uint)(byte)(cVar1 + 0x9cU +
                                               ((byte)(cVar1 + 0x9cU) / 9 & 0xfc) * -9),dibit);
            symbolIndex_00 = this->m_symbolIndex;
          }
          this->m_symbolIndex = symbolIndex_00 + 1;
          if (symbolIndex_00 + 1 != 0x2f4) {
            return;
          }
          this->m_state = DPMRPostFrame;
          this->m_frameType = DPMRNoFrame;
          this->m_symbolIndex = 0;
          return;
        }
        symbolIndex_00 = symbolIndex_00 - 0x240;
      }
    }
  }
  processCCH(this,symbolIndex_00,dibit);
LAB_0011aee7:
  this->m_symbolIndex = this->m_symbolIndex + 1;
  return;
}

Assistant:

void DSDdPMR::processSuperFrame()
{
    int dibit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get di-bit from symbol

    if (m_symbolIndex == 0) // new frame
    {
        m_frameType = DPMRPayloadFrame;
        m_frameIndex = 0;
        m_dsdDecoder->getLogger().log("DSDdPMR::processSuperFrame: start\n"); // DEBUG
    }

    if (m_symbolIndex < 36) // Start of frame 0 - CCH0
    {
        m_calledIdHalf = false;
        m_ownIdHalf = false;
        processCCH(m_symbolIndex, dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144) // TCH0
    {
        processTCH(m_symbolIndex - 36, dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12) // Start of frame 1 - CC0
    {
        processColourCode(m_symbolIndex - (36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36) // CCH1
    {
        processCCH(m_symbolIndex - (36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144) // TCH1
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12) // Start of frame 2 - FS2-1
    {
        processFS2(m_symbolIndex - (36 + 144 + 12 + 36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36) // CCH2
    {
        processCCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // TCH2
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12) // Start of frame 3 - CC1
    {
        processColourCode(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36) // CCH3
    {
        processCCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // TCH3
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;

        if (m_symbolIndex == 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // end of super frame
        {
            m_frameType = DPMRNoFrame; // look for continuation or end
            m_state = DPMRPostFrame;
            m_symbolIndex = 0;
        }
    }
    else // shouldn´t go there => out of sync error
    {
    	m_frameType = DPMRNoFrame;
        m_dsdDecoder->resetFrameSync(); // end
    }
}